

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O0

void __thiscall QtMWidgets::PageViewPrivate::preparePages(PageViewPrivate *this,QRect *r)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int awidth;
  int aheight;
  const_reference ppQVar5;
  undefined1 local_58 [8];
  QRect right;
  QWidget *w_1;
  undefined1 local_38 [8];
  QRect left;
  QWidget *w;
  int index;
  QRect *r_local;
  PageViewPrivate *this_local;
  
  iVar2 = PageControl::currentIndex(this->control);
  if (iVar2 != 0) {
    ppQVar5 = QList<QWidget_*>::at(&this->pages,(long)(iVar2 + -1));
    left._8_8_ = *ppQVar5;
    local_38._0_4_ = r->x1;
    local_38._4_4_ = r->y1;
    left.x1 = r->x2;
    left.y1 = r->y2;
    iVar3 = QRect::x(r);
    iVar4 = QRect::width(r);
    QRect::moveLeft((QRect *)local_38,iVar3 - iVar4);
    uVar1 = left._8_8_;
    QRect::topLeft((QRect *)local_38);
    QWidget::move((QPoint *)uVar1);
    QWidget::show();
  }
  iVar3 = PageControl::count(this->control);
  if (iVar2 < iVar3 + -1) {
    ppQVar5 = QList<QWidget_*>::at(&this->pages,(long)(iVar2 + 1));
    right._8_8_ = *ppQVar5;
    iVar2 = QRect::x(r);
    iVar3 = QRect::width(r);
    iVar4 = QRect::y(r);
    awidth = QRect::width(r);
    aheight = QRect::height(r);
    QRect::QRect((QRect *)local_58,iVar2 + iVar3,iVar4,awidth,aheight);
    uVar1 = right._8_8_;
    QRect::topLeft((QRect *)local_58);
    QWidget::move((QPoint *)uVar1);
    QWidget::show();
  }
  QWidget::raise();
  this->pagesPrepared = true;
  return;
}

Assistant:

void
PageViewPrivate::preparePages( const QRect & r )
{
	const int index = control->currentIndex();

	if( index != 0 )
	{
		QWidget * w = pages.at( index - 1 );

		QRect left = r;
		left.moveLeft( r.x() - r.width() );

		w->move( left.topLeft() );

		w->show();
	}

	if( index < control->count() - 1 )
	{
		QWidget * w = pages.at( index + 1 );

		const QRect right( r.x() + r.width(), r.y(), r.width(), r.height() );

		w->move( right.topLeft() );

		w->show();
	}

	control->raise();

	pagesPrepared = true;
}